

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hayai_console_outputter.hpp
# Opt level: O0

void __thiscall
hayai::ConsoleOutputter::BeginTest
          (ConsoleOutputter *this,string *fixtureName,string *testName,
          TestParametersDescriptor *parameters,size_t *runsCount,size_t *iterationsCount)

{
  size_t *iterationsCount_local;
  size_t *runsCount_local;
  TestParametersDescriptor *parameters_local;
  string *testName_local;
  string *fixtureName_local;
  ConsoleOutputter *this_local;
  
  BeginOrSkipTest(this,fixtureName,testName,parameters,runsCount,iterationsCount,false);
  return;
}

Assistant:

virtual void BeginTest(const std::string& fixtureName,
                               const std::string& testName,
                               const TestParametersDescriptor& parameters,
                               const std::size_t& runsCount,
                               const std::size_t& iterationsCount)
        {
            BeginOrSkipTest(fixtureName,
                            testName,
                            parameters,
                            runsCount,
                            iterationsCount,
                            false);
        }